

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::ReturnStmt> __thiscall
mocker::Parser::returnStmt(Parser *this,TokIter *iter,TokIter end)

{
  long lVar1;
  Token *pTVar2;
  TokenID TVar3;
  SyntaxError *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<mocker::ast::ReturnStmt> sVar5;
  Position beg;
  Position beg_00;
  Position end_00;
  Position end_01;
  Position begPos;
  GetTokenID id;
  shared_ptr<mocker::ast::Expression> expr;
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *local_50;
  size_t sStack_48;
  Position local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  Token::position(*end._M_current);
  begPos.line = (size_t)local_50;
  begPos.col = sStack_48;
  TVar3 = GetTokenID::operator()(&id,*end._M_current);
  if (TVar3 == Return) {
    lVar1 = *(long *)end._M_current;
    *(Token **)end._M_current = (Token *)(lVar1 + 0x38);
    TVar3 = GetTokenID::operator()(&id,(Token *)(lVar1 + 0x38));
    if (TVar3 != Semicolon) {
      assignmentExpr((Parser *)&expr,iter,end);
      if (expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        TVar3 = GetTokenID::operator()(&id,*end._M_current);
        if (TVar3 == Semicolon) {
          pTVar2 = *end._M_current;
          *(Token **)end._M_current = pTVar2 + 1;
          Token::position(pTVar2);
          beg_00.col = begPos.line;
          beg_00.line = (size_t)iter;
          end_01.col = local_40.line;
          end_01.line = begPos.col;
          makeNode<mocker::ast::ReturnStmt,std::shared_ptr<mocker::ast::Expression>&>
                    (this,beg_00,end_01,(shared_ptr<mocker::ast::Expression> *)local_40.col);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          _Var4._M_pi = extraout_RDX_00;
          goto LAB_00171f73;
        }
      }
      this_00 = (SyntaxError *)__cxa_allocate_exception(0x48);
      Token::position(*end._M_current);
      SyntaxError::SyntaxError(this_00,&begPos,&local_40);
      __cxa_throw(this_00,&SyntaxError::typeinfo,CompileError::~CompileError);
    }
    pTVar2 = *end._M_current;
    *(Token **)end._M_current = pTVar2 + 1;
    Token::position(pTVar2);
    expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    beg.col = begPos.line;
    beg.line = (size_t)iter;
    end_00.col = local_40.line;
    end_00.line = begPos.col;
    sVar5 = makeNode<mocker::ast::ReturnStmt,decltype(nullptr)>
                      (this,beg,end_00,(void **)local_40.col);
    _Var4 = sVar5.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    _Var4._M_pi = extraout_RDX;
  }
LAB_00171f73:
  sVar5.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::ReturnStmt>)
         sVar5.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::ReturnStmt> Parser::returnStmt(TokIter &iter,
                                                    TokIter end) {
  auto begPos = iter->position().first;

  auto id = GetTokenID(end);
  if (id(iter) != TokenID::Return)
    return nullptr;
  ++iter;
  if (id(iter) == TokenID::Semicolon)
    return makeNode<ast::ReturnStmt>(begPos, (iter++)->position().second,
                                     nullptr);
  auto expr = expression(iter, end);
  if (!expr || id(iter) != TokenID::Semicolon)
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::ReturnStmt>(begPos, (iter++)->position().second, expr);
}